

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O2

void __thiscall
iqnet::Reactor<boost::mutex>::register_handler
          (Reactor<boost::mutex> *this,Event_handler *eh,Event_mask mask)

{
  ushort *puVar1;
  int iVar2;
  iterator iVar3;
  hs_iterator hVar4;
  mapped_type *ppEVar5;
  Handler fd;
  scoped_lock lk;
  int local_3c;
  unique_lock<boost::mutex> local_38;
  value_type local_28;
  
  boost::unique_lock<boost::mutex>::unique_lock(&local_38,&this->lock);
  iVar2 = (*eh->_vptr_Event_handler[2])(eh);
  if ((char)iVar2 != '\0') {
    this->num_stoppers = this->num_stoppers + 1;
  }
  local_3c = (*eh->_vptr_Event_handler[9])(eh);
  iVar3 = std::
          _Rb_tree<int,_std::pair<const_int,_iqnet::Event_handler_*>,_std::_Select1st<std::pair<const_int,_iqnet::Event_handler_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_iqnet::Event_handler_*>_>_>
          ::find(&(this->handlers)._M_t,&local_3c);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->handlers)._M_t._M_impl.super__Rb_tree_header) {
    local_28.fd = local_3c;
    local_28.revents = 0;
    local_28.mask = (ushort)mask;
    std::__cxx11::
    list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>::
    push_back(&this->handlers_states,&local_28);
    ppEVar5 = std::
              map<int,_iqnet::Event_handler_*,_std::less<int>,_std::allocator<std::pair<const_int,_iqnet::Event_handler_*>_>_>
              ::operator[](&this->handlers,&local_3c);
    *ppEVar5 = eh;
  }
  else {
    hVar4 = find_handler_state(this,eh);
    puVar1 = (ushort *)((long)&hVar4._M_node[1]._M_next + 4);
    *puVar1 = *puVar1 | (ushort)mask;
  }
  boost::unique_lock<boost::mutex>::~unique_lock(&local_38);
  return;
}

Assistant:

void Reactor<Lock>::register_handler( Event_handler* eh, Event_mask mask )
{
  scoped_lock lk(lock);

  if (eh->is_stopper())
    num_stoppers++;

  Socket::Handler fd = eh->get_handler();

  if( handlers.find(fd) == handlers.end() )
  {
    handlers_states.push_back( HandlerState(fd, mask) );
    handlers[fd] = eh;
  }
  else
  {
    typename Reactor<Lock>::hs_iterator i = find_handler_state(eh);
    i->mask |= mask;
  }
}